

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::clear
          (array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *this)

{
  CJoystick *pCVar1;
  
  if (this->list != (CJoystick *)0x0) {
    operator_delete__(this->list);
  }
  this->list_size = 1;
  pCVar1 = (CJoystick *)operator_new__(0x98);
  (pCVar1->super_IJoystick)._vptr_IJoystick = (_func_int **)&PTR_GetIndex_00211550;
  this->list = pCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}